

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPML_TAGGED_POLICY_Unmarshal(TPML_TAGGED_POLICY *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPML_TAGGED_POLICY *target_local;
  
  target_local._4_4_ = UINT32_Unmarshal(&target->count,buffer,size);
  if (target_local._4_4_ == 0) {
    if (target->count < 0xf) {
      target_local._4_4_ =
           TPMS_TAGGED_POLICY_Array_Unmarshal(target->policies,buffer,size,target->count);
    }
    else {
      target_local._4_4_ = 0x84;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPML_TAGGED_POLICY_Unmarshal(TPML_TAGGED_POLICY *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)&(target->count), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if((target->count) > MAX_TAGGED_POLICIES)
        return TPM_RC_VALUE;
    result = TPMS_TAGGED_POLICY_Array_Unmarshal((TPMS_TAGGED_POLICY *)(target->policies), buffer, size, (INT32)(target->count));
    return result;
}